

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void bits2int(uECC_word_t *native,uint8_t *bits,uint bits_size,uECC_Curve curve)

{
  ulong *puVar1;
  byte bVar2;
  ulong uVar3;
  uECC_word_t *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint num_bytes;
  int iVar10;
  
  iVar9 = (int)curve->num_n_bits;
  iVar10 = iVar9 + 0xe;
  if (-1 < iVar9 + 7) {
    iVar10 = iVar9 + 7;
  }
  uVar5 = iVar9 + 0x3fU;
  if ((int)(iVar9 + 0x3fU) < 0) {
    uVar5 = iVar9 + 0x7eU;
  }
  uVar5 = (int)uVar5 >> 6;
  num_bytes = iVar10 >> 3;
  if (bits_size <= (uint)(iVar10 >> 3)) {
    num_bytes = bits_size;
  }
  if ('\0' < (char)uVar5) {
    memset(native,0,(ulong)((uVar5 & 0x7f) << 3));
  }
  uECC_vli_bytesToNative(native,bits,num_bytes);
  iVar10 = num_bytes * 8 - (int)curve->num_n_bits;
  if ((uint)(int)curve->num_n_bits <= num_bytes * 8 && iVar10 != 0) {
    if (0x7e < iVar9 + 0x7eU) {
      puVar4 = native + uVar5;
      bVar2 = (byte)iVar10;
      uVar8 = 0;
      do {
        uVar3 = puVar4[-1];
        puVar4[-1] = uVar3 >> (bVar2 & 0x3f) | uVar8;
        uVar8 = uVar3 << (0x40 - bVar2 & 0x3f);
        puVar4 = puVar4 + -1;
      } while (native < puVar4);
    }
    uVar8 = (ulong)(uVar5 & 0xff);
    do {
      uVar8 = uVar8 - 1;
      if ((char)uVar8 < '\0') break;
      uVar6 = (ulong)(((uint)uVar8 & 0x7f) << 3);
      uVar3 = *(ulong *)((long)curve->n + uVar6);
      uVar6 = *(ulong *)((long)native + uVar6);
      if (uVar6 < uVar3) {
        return;
      }
    } while (uVar6 <= uVar3);
    if ('\0' < (char)uVar5) {
      uVar3 = 0;
      uVar8 = 0;
      do {
        uVar7 = curve->n[uVar3] + uVar8;
        puVar1 = native + uVar3;
        uVar6 = *puVar1;
        *puVar1 = *puVar1 - uVar7;
        if (uVar7 != 0) {
          uVar8 = (ulong)(uVar6 < uVar7);
        }
        uVar3 = uVar3 + 1;
      } while ((uVar5 & 0xff) != uVar3);
    }
  }
  return;
}

Assistant:

static void bits2int(uECC_word_t *native,
                     const uint8_t *bits,
                     unsigned bits_size,
                     uECC_Curve curve) {
    unsigned num_n_bytes = BITS_TO_BYTES(curve->num_n_bits);
    unsigned num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    int shift;
    uECC_word_t carry;
    uECC_word_t *ptr;

    if (bits_size > num_n_bytes) {
        bits_size = num_n_bytes;
    }

    uECC_vli_clear(native, num_n_words);
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) native, bits, bits_size);
#else
    uECC_vli_bytesToNative(native, bits, bits_size);
#endif
    if (bits_size * 8 <= (unsigned)curve->num_n_bits) {
        return;
    }
    shift = bits_size * 8 - curve->num_n_bits;
    carry = 0;
    ptr = native + num_n_words;
    while (ptr-- > native) {
        uECC_word_t temp = *ptr;
        *ptr = (temp >> shift) | carry;
        carry = temp << (uECC_WORD_BITS - shift);
    }

    /* Reduce mod curve_n */
    if (uECC_vli_cmp_unsafe(curve->n, native, num_n_words) != 1) {
        uECC_vli_sub(native, native, curve->n, num_n_words);
    }
}